

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::ConstPixelBufferAccess::getPixel(ConstPixelBufferAccess *this,int x,int y,int z)

{
  ushort uVar1;
  Channel CVar2;
  uint uVar3;
  ushort uVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [13];
  undefined1 auVar8 [14];
  ChannelOrder CVar9;
  int iVar10;
  Float<unsigned_int,_8,_23,_127,_3U> FVar11;
  Float<unsigned_int,_8,_23,_127,_3U> FVar12;
  Float<unsigned_int,_8,_23,_127,_3U> FVar13;
  TextureSwizzle *pTVar14;
  ChannelOrder CVar15;
  undefined4 in_register_00000034;
  ChannelOrder *pCVar16;
  int in_R8D;
  uint *puVar17;
  int c;
  long lVar18;
  TextureFormat TVar20;
  undefined1 auVar22 [14];
  float fVar19;
  undefined1 in_XMM0 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar21;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [14];
  undefined1 auVar38 [16];
  Vector<float,_4> VVar39;
  Vec4 VVar40;
  Vector<float,_4> local_58;
  Vector<unsigned_int,_4> local_44;
  Float<unsigned_int,_5,_5,_15,_2U> local_34;
  Vec4 VVar41;
  Vec4 VVar42;
  Vec4 VVar43;
  Vec4 VVar44;
  Vec4 VVar45;
  Vec4 VVar46;
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 extraout_var [12];
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  
  pCVar16 = (ChannelOrder *)CONCAT44(in_register_00000034,x);
  puVar17 = (uint *)((long)(int)(in_R8D * pCVar16[7]) + (long)(int)(z * pCVar16[6]) +
                    (long)(int)(y * pCVar16[5]) + *(undefined8 *)(pCVar16 + 8));
  auVar36._4_12_ = in_XMM0._4_12_;
  auVar33._4_12_ = in_XMM1._4_12_;
  switch(pCVar16[1]) {
  case L:
    switch(*pCVar16) {
    case RGB:
    case sRGB:
      fVar19 = (float)*(byte *)((long)puVar17 + 2) / 255.0;
      auVar30._0_4_ = (float)((ushort)*puVar17 & 0xff);
      auVar30._4_4_ = (float)(byte)((ushort)*puVar17 >> 8);
      auVar30._8_8_ = 0;
      in_XMM1 = divps(auVar30,_DAT_00895d10);
      break;
    case RGBA:
    case sRGBA:
      uVar3 = *puVar17;
      auVar7[0xc] = (char)(uVar3 >> 0x18);
      auVar7._0_12_ = ZEXT712(0);
      auVar29._0_4_ = (float)(uVar3 & 0xff);
      auVar29._4_4_ = (float)(uVar3 >> 8 & 0xff);
      auVar29._8_4_ = (float)(int)CONCAT32(auVar7._10_3_,(ushort)(byte)(uVar3 >> 0x10));
      auVar29._12_4_ = (float)(uint3)(auVar7._10_3_ >> 0x10);
      auVar36 = divps(auVar29,_DAT_008180c0);
      (this->m_format).order = (int)auVar36._0_8_;
      (this->m_format).type = (int)((ulong)auVar36._0_8_ >> 0x20);
      (this->m_size).m_data[0] = auVar36._8_4_;
      (this->m_size).m_data[1] = auVar36._12_4_;
      VVar41.m_data[0] = (float)(int)auVar36._0_8_;
      auVar48._4_4_ = (float)(int)(auVar36._0_8_ >> 0x20);
      register0x00001240 = 0.0;
      register0x00001244 = 0.0;
      return (Vec4)VVar41.m_data;
    default:
      goto switchD_007af96b_caseD_4;
    }
    goto LAB_007afced;
  default:
switchD_007af96b_caseD_4:
    Vector<float,_4>::Vector((Vector<float,_4> *)this);
    pTVar14 = getChannelReadSwizzle(*pCVar16);
    iVar10 = getChannelSize(pCVar16[1]);
    lVar18 = 0;
    auVar23 = extraout_XMM0;
    do {
      if (lVar18 == 4) {
        VVar46.m_data[0] = (float)(int)auVar23._0_8_;
        auVar53._4_4_ = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
        register0x00001240 = (float)(int)in_XMM1._0_8_;
        register0x00001244 = (float)(int)((ulong)in_XMM1._0_8_ >> 0x20);
        return (Vec4)VVar46.m_data;
      }
      CVar2 = pTVar14->components[lVar18];
      if (CVar2 < CHANNEL_ZERO) {
        auVar23._0_4_ =
             anon_unknown_74::channelToFloat
                       ((byte *)((long)(int)(CVar2 * iVar10) + (long)puVar17),pCVar16[1]);
        auVar23._4_12_ = extraout_var;
LAB_007afa04:
        (this->m_size).m_data[lVar18 + -2] = auVar23._0_4_;
      }
      else {
        if (CVar2 == CHANNEL_ZERO) {
          auVar23 = ZEXT816(0);
          goto LAB_007afa04;
        }
        if (CVar2 == CHANNEL_ONE) {
          auVar23._0_12_ = ZEXT812(0x3f800000);
          auVar23._12_4_ = 0;
          goto LAB_007afa04;
        }
      }
      lVar18 = lVar18 + 1;
    } while( true );
  case RGB:
    auVar25._0_4_ = (float)(byte)((byte)*puVar17 >> 4);
    auVar25._4_4_ = (float)((byte)*puVar17 & 0xf);
    auVar25._8_8_ = 0;
    auVar36 = divps(auVar25,_DAT_00895d00);
    TVar20 = auVar36._0_8_;
    this->m_format = TVar20;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0x3f800000;
    VVar42.m_data[0] = (float)TVar20.order;
    auVar49._4_4_ = (float)TVar20.type;
    register0x00001240 = (float)(int)in_XMM1._0_8_;
    register0x00001244 = (float)(int)((ulong)in_XMM1._0_8_ >> 0x20);
    return (Vec4)VVar42.m_data;
  case RGBA:
    uVar1 = (ushort)*puVar17;
    auVar32._0_4_ = (float)(uVar1 >> 0xb);
    auVar32._4_4_ = (float)(uVar1 >> 5 & 0x3f);
    auVar32._8_8_ = 0;
    auVar36 = divps(auVar32,_DAT_00895cf0);
    local_58.m_data[2] = (float)(uVar1 & 0x1f) / 31.0;
    local_58.m_data._0_8_ = auVar36._0_8_;
    goto LAB_007afc47;
  case ARGB:
    uVar1 = (ushort)*puVar17;
    auVar22 = ZEXT414(CONCAT22(uVar1,uVar1 >> 5)) & DAT_00895c40._0_14_;
    auVar31._0_4_ = (float)auVar22._0_2_;
    auVar31._4_4_ = (float)(int)CONCAT82(SUB148(ZEXT214(0) << 0x40,6),auVar22._2_2_);
    auVar31._8_8_ = 0;
    auVar36 = divps(auVar31,_DAT_00895c50);
    local_58.m_data._4_8_ = auVar36._0_8_;
    local_58.m_data[0] = (float)(uVar1 >> 10 & 0x1f) / 31.0;
LAB_007afc47:
    local_58.m_data[3] = 1.0;
    CVar15 = *pCVar16;
    CVar9 = RGB;
    goto LAB_007afe98;
  case BGR:
    uVar1 = (ushort)*puVar17;
    auVar36 = ZEXT616(CONCAT24(uVar1 >> 4,CONCAT22(uVar1 >> 8,uVar1)));
    auVar36 = pshuflw(auVar36,auVar36,0x24);
    auVar37 = ~DAT_00895cd0._0_14_ & ZEXT214(uVar1 >> 0xc) |
              auVar36._0_14_ & DAT_00895cc0._0_14_ & DAT_00895cd0._0_14_;
    auVar22._10_2_ = 0;
    auVar22._0_10_ = auVar37._0_10_;
    auVar22._12_2_ = auVar37._6_2_;
    auVar5._8_2_ = auVar37._4_2_;
    auVar5._0_8_ = auVar37._0_8_;
    auVar5._10_4_ = auVar22._10_4_;
    auVar8._6_8_ = 0;
    auVar8._0_6_ = auVar5._8_6_;
    auVar6._4_2_ = auVar37._2_2_;
    auVar6._0_4_ = auVar37._0_4_;
    auVar6._6_8_ = SUB148(auVar8 << 0x40,6);
    auVar24._0_4_ = (float)(auVar37._0_4_ & 0xffff);
    auVar24._4_4_ = (float)auVar6._4_4_;
    auVar24._8_4_ = (float)auVar5._8_4_;
    auVar24._12_4_ = (float)(auVar22._10_4_ >> 0x10);
    local_58.m_data = (float  [4])divps(auVar24,_DAT_00895ce0);
    break;
  case BGRA:
    uVar1 = (ushort)*puVar17;
    auVar38._0_4_ = (float)(uVar1 >> 0xb);
    auVar38._4_4_ = (float)(uVar1 >> 6 & 0x1f);
    auVar38._8_8_ = 0;
    auVar36 = divps(auVar38,_DAT_00895c50);
    local_58.m_data[2] = (float)(uVar1 >> 1 & 0x1f) / 31.0;
    local_58.m_data[0] = (float)(int)auVar36._0_8_;
    local_58.m_data[1] = (float)(int)((ulong)auVar36._0_8_ >> 0x20);
    local_58.m_data[3] = (float)(uVar1 & 1);
    break;
  case sR:
    uVar1 = (ushort)*puVar17;
    auVar33._0_4_ = (float)(uVar1 >> 0xf);
    auVar22 = ZEXT414(CONCAT22(uVar1,uVar1 >> 5)) & DAT_00895c40._0_14_;
    (this->m_format).order = (ChannelOrder)((float)(uVar1 >> 10 & 0x1f) / 31.0);
    auVar26._0_4_ = (float)auVar22._0_2_;
    auVar26._4_4_ = (float)(int)CONCAT82(SUB148(ZEXT214(0) << 0x40,6),auVar22._2_2_);
    auVar26._8_8_ = 0;
    auVar36 = divps(auVar26,_DAT_00895c50);
    uVar21 = auVar36._0_8_;
    *(undefined8 *)&(this->m_format).type = uVar21;
    (this->m_size).m_data[1] = (int)auVar33._0_4_;
    VVar43.m_data[0] = (float)(int)uVar21;
    auVar50._4_4_ = (float)(int)((ulong)uVar21 >> 0x20);
    register0x00001240 = (float)(int)auVar33._0_8_;
    register0x00001244 = (float)(int)((ulong)auVar33._0_8_ >> 0x20);
    return (Vec4)VVar43.m_data;
  case sRG:
    uVar3 = *puVar17;
    fVar19 = (float)(uVar3 >> 2 & 0x3ff) / 1023.0;
    auVar34._0_4_ = (float)(uVar3 >> 0x16);
    auVar34._4_4_ = (float)(uVar3 >> 0xc & 0x3ff);
    auVar34._8_8_ = 0;
    in_XMM1 = divps(auVar34,_DAT_00895cb0);
LAB_007afced:
    auVar36._0_4_ = fVar19;
    this->m_format = in_XMM1._0_8_;
    (this->m_size).m_data[0] = (int)fVar19;
LAB_007aff52:
    (this->m_size).m_data[1] = 0x3f800000;
    VVar45.m_data[0] = (float)(int)auVar36._0_8_;
    auVar52._4_4_ = (float)(int)((ulong)auVar36._0_8_ >> 0x20);
    register0x00001240 = (float)(int)in_XMM1._0_8_;
    register0x00001244 = (float)(int)((ulong)in_XMM1._0_8_ >> 0x20);
    return (Vec4)VVar45.m_data;
  case sRGB:
    uVar3 = *puVar17;
    auVar28._0_4_ = (float)(int)(-(uVar3 & 0x200) | uVar3 & 0x3ff) / 511.0;
    auVar35._0_4_ = (float)(int)(-(uVar3 >> 10 & 0x200) | uVar3 >> 10 & 0x3ff);
    auVar35._4_4_ = (float)(int)(-(uVar3 >> 0x14 & 0x200) | uVar3 >> 0x14 & 0x3ff);
    auVar35._8_8_ = 0;
    auVar36 = divps(auVar35,_DAT_00895c80);
    auVar28._4_4_ = auVar36._0_4_;
    auVar28._8_4_ = auVar36._4_4_;
    auVar28._12_4_ = (float)(int)(-(uVar3 >> 0x1e & 0xfffffffe) | uVar3 >> 0x1e);
    local_58.m_data = (float  [4])maxps(_DAT_00817fe0,auVar28);
    break;
  case sRGBA:
    uVar3 = *puVar17;
    auVar27._0_4_ = (float)(uVar3 & 0x3ff);
    auVar27._4_4_ = (float)(uVar3 >> 10 & 0x3ff);
    auVar27._8_4_ = (float)(uVar3 >> 0x14 & 0x3ff);
    auVar27._12_4_ = (float)(uVar3 >> 0x1e);
    local_58.m_data = (float  [4])divps(auVar27,_DAT_00895ca0);
    break;
  case sBGR:
    local_58.m_data._0_8_ =
         (ulong)CONCAT14((byte)*puVar17,(uint)(byte)((byte)*puVar17 >> 4)) & 0xfffffffff;
    local_58.m_data[2] = 0.0;
    local_58.m_data[3] = 1.4013e-45;
    goto LAB_007afda5;
  case sBGRA:
    uVar1 = (ushort)*puVar17;
    local_44.m_data[0] = (uint)(uVar1 >> 0xb);
    local_44.m_data[1] = uVar1 >> 5 & 0x3f;
    local_44.m_data[2] = uVar1 & 0x1f;
    local_44.m_data[3] = 1;
    CVar15 = *pCVar16;
    CVar9 = RGB;
    goto LAB_007afd96;
  case D:
    uVar1 = (ushort)*puVar17;
    uVar4 = uVar1 >> 0xc;
    local_44.m_data[1] = uVar1 >> 8 & 0xf;
    local_44.m_data[2] = uVar1 >> 4 & 0xf;
    local_44.m_data[3] = uVar1 & 0xf;
    goto LAB_007afaea;
  case S:
    uVar1 = (ushort)*puVar17;
    uVar4 = uVar1 >> 0xb;
    local_44.m_data[1] = uVar1 >> 6 & 0x1f;
    local_44.m_data[2] = uVar1 >> 1 & 0x1f;
    local_44.m_data[3] = uVar1 & 1;
LAB_007afaea:
    local_44.m_data[0] = (uint)uVar4;
    goto LAB_007afd8e;
  case DS:
    uVar3 = *puVar17;
    local_44.m_data[0] = -(uVar3 & 0x200) | uVar3 & 0x3ff;
    local_44.m_data[1] = -(uVar3 >> 10 & 0x200) | uVar3 >> 10 & 0x3ff;
    local_44.m_data[2] = -(uVar3 >> 0x14 & 0x200) | uVar3 >> 0x14 & 0x3ff;
    local_44.m_data[3] = -(uVar3 >> 0x1e & 0xfffffffe) | uVar3 >> 0x1e;
    goto LAB_007afd8e;
  case CHANNELORDER_LAST:
    local_44.m_data[3] = *puVar17;
    local_44.m_data[0] = local_44.m_data[3] & 0x3ff;
    local_44.m_data[1] = local_44.m_data[3] >> 10 & 0x3ff;
    local_44.m_data[2] = local_44.m_data[3] >> 0x14 & 0x3ff;
    local_44.m_data[3] = local_44.m_data[3] >> 0x1e;
LAB_007afd8e:
    CVar15 = *pCVar16;
    CVar9 = RGBA;
LAB_007afd96:
    swizzleRB<unsigned_int>((tcu *)&local_58,&local_44,CVar15,CVar9);
LAB_007afda5:
    VVar39 = Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    VVar44.m_data[0] = VVar39.m_data[0];
    auVar51._4_4_ = VVar39.m_data[1];
    register0x00001240 = VVar39.m_data[2];
    register0x00001244 = VVar39.m_data[3];
    return (Vec4)VVar44.m_data;
  case DS|I:
    local_58.m_data[0] = (float)(*puVar17 & 0x7ff);
    FVar11 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,2u>
                       ((Float<unsigned_int,_5,_6,_15,_2U> *)&local_58);
    local_44.m_data[0] = *puVar17 >> 0xb & 0x7ff;
    FVar12 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,2u>
                       ((Float<unsigned_int,_5,_6,_15,_2U> *)&local_44);
    local_34.m_value = *puVar17 >> 0x16;
    FVar13 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,5,15,2u>(&local_34);
    (this->m_format).order = FVar11.m_value;
    (this->m_format).type = FVar12.m_value;
    (this->m_size).m_data[0] = FVar13.m_value;
    auVar36 = extraout_XMM0_00;
    goto LAB_007aff52;
  case DS|L:
    uVar3 = *puVar17;
    auVar36._0_4_ = ldexpf(1.0,(uVar3 >> 0x1b) - 0x18);
    auVar36._4_12_ = extraout_var_00;
    in_XMM1._0_4_ = (float)(uVar3 & 0x1ff) * auVar36._0_4_;
    (this->m_format).order = (ChannelOrder)in_XMM1._0_4_;
    (this->m_format).type = (ChannelType)((float)(uVar3 >> 9 & 0x1ff) * auVar36._0_4_);
    (this->m_size).m_data[0] = (int)((float)(uVar3 >> 0x12 & 0x1ff) * auVar36._0_4_);
    goto LAB_007aff52;
  }
  CVar15 = *pCVar16;
  CVar9 = RGBA;
LAB_007afe98:
  VVar39 = swizzleRB<float>((tcu *)this,&local_58,CVar15,CVar9);
  VVar40.m_data[0] = VVar39.m_data[0];
  auVar47._4_4_ = VVar39.m_data[1];
  register0x00001240 = VVar39.m_data[2];
  register0x00001244 = VVar39.m_data[3];
  return (Vec4)VVar40.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::getPixel (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, m_size.x()));
	DE_ASSERT(de::inBounds(y, 0, m_size.y()));
	DE_ASSERT(de::inBounds(z, 0, m_size.z()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	const deUint8* pixelPtr = (const deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
			return readRGBA8888Float(pixelPtr);
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
			return readRGB888Float(pixelPtr);
	}

#define UI8(OFFS, COUNT)		((*((const deUint8*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define UI16(OFFS, COUNT)		((*((const deUint16*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define UI32(OFFS, COUNT)		((*((const deUint32*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define SI32(OFFS, COUNT)		signExtend(UI32(OFFS, COUNT), (COUNT))
#define UN8(OFFS, COUNT)		channelToUnormFloat(UI8 (OFFS, COUNT), (COUNT))
#define UN16(OFFS, COUNT)		channelToUnormFloat(UI16(OFFS, COUNT), (COUNT))
#define UN32(OFFS, COUNT)		channelToUnormFloat(UI32(OFFS, COUNT), (COUNT))
#define SN32(OFFS, COUNT)		channelToSnormFloat(UI32(OFFS, COUNT), (COUNT))

	// Packed formats.
	switch (m_format.type)
	{
		case TextureFormat::UNORM_BYTE_44:				return			  Vec4(UN8 (4,   4), UN8 ( 0,  4), 0.0f, 1.0f);
		case TextureFormat::UNSIGNED_BYTE_44:			return			 UVec4(UI8 (4,   4), UI8 ( 0,  4), 0u, 1u).cast<float>();
		case TextureFormat::UNORM_SHORT_565:			return swizzleRB( Vec4(UN16(11,  5), UN16( 5,  6), UN16( 0,  5), 1.0f), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNSIGNED_SHORT_565:			return swizzleRB(UVec4(UI16(11,  5), UI16( 5,  6), UI16( 0,  5), 1u), m_format.order, TextureFormat::RGB).cast<float>();
		case TextureFormat::UNORM_SHORT_555:			return swizzleRB( Vec4(UN16(10,  5), UN16( 5,  5), UN16( 0,  5), 1.0f), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNORM_SHORT_4444:			return swizzleRB( Vec4(UN16(12,  4), UN16( 8,  4), UN16( 4,  4), UN16( 0, 4)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_4444:		return swizzleRB(UVec4(UI16(12,  4), UI16( 8,  4), UI16( 4,  4), UI16( 0, 4)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNORM_SHORT_5551:			return swizzleRB( Vec4(UN16(11,  5), UN16( 6,  5), UN16( 1,  5), UN16( 0, 1)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_5551:		return swizzleRB(UVec4(UI16(11,  5), UI16( 6,  5), UI16( 1,  5), UI16( 0, 1)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNORM_INT_101010:			return			  Vec4(UN32(22, 10), UN32(12, 10), UN32( 2, 10), 1.0f);
		case TextureFormat::UNORM_INT_1010102_REV:		return swizzleRB( Vec4(UN32( 0, 10), UN32(10, 10), UN32(20, 10), UN32(30, 2)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::SNORM_INT_1010102_REV:		return swizzleRB( Vec4(SN32( 0, 10), SN32(10, 10), SN32(20, 10), SN32(30, 2)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_INT_1010102_REV:	return swizzleRB( UVec4(UI32(0, 10), UI32(10, 10), UI32(20, 10), UI32(30, 2)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::SIGNED_INT_1010102_REV:		return swizzleRB( UVec4(SI32(0, 10), SI32(10, 10), SI32(20, 10), SI32(30, 2)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNSIGNED_INT_999_E5_REV:	return unpackRGB999E5(*((const deUint32*)pixelPtr));

		case TextureFormat::UNORM_SHORT_1555:
			DE_ASSERT(m_format.order == TextureFormat::ARGB);
			return Vec4(UN16(15, 1), UN16(10, 5), UN16(5, 5), UN16(0, 5)).swizzle(1,2,3,0); // ARGB -> RGBA

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
			return Vec4(Float11(UI32(0, 11)).asFloat(), Float11(UI32(11, 11)).asFloat(), Float10(UI32(22, 10)).asFloat(), 1.0f);

		default:
			break;
	}

#undef UN8
#undef UN16
#undef UN32
#undef SN32
#undef SI32
#undef UI8
#undef UI16
#undef UI32

	// Generic path.
	Vec4							result;
	const TextureSwizzle::Channel*	channelMap	= getChannelReadSwizzle(m_format.order).components;
	int								channelSize	= getChannelSize(m_format.type);

	for (int c = 0; c < 4; c++)
	{
		switch (channelMap[c])
		{
			case TextureSwizzle::CHANNEL_0:
			case TextureSwizzle::CHANNEL_1:
			case TextureSwizzle::CHANNEL_2:
			case TextureSwizzle::CHANNEL_3:
				result[c] = channelToFloat(pixelPtr + channelSize*((int)channelMap[c]), m_format.type);
				break;

			case TextureSwizzle::CHANNEL_ZERO:
				result[c] = 0.0f;
				break;

			case TextureSwizzle::CHANNEL_ONE:
				result[c] = 1.0f;
				break;

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}